

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O0

bool s2shapeutil::VisitCrossingEdgePairs
               (S2ShapeIndex *a_index,S2ShapeIndex *b_index,CrossingType type,
               EdgePairVisitor *visitor)

{
  bool bVar1;
  int iVar2;
  uint64 uVar3;
  uint64 uVar4;
  S2ShapeIndexCell *pSVar5;
  S2ShapeIndexCell *b_cell;
  byte local_fde;
  S2CellId local_fd8;
  S2CellId local_fd0;
  long local_fc8;
  int64 ab_relation;
  S2CellId local_fb8;
  uint64 local_fb0;
  S2CellId local_fa8;
  undefined1 local_fa0 [8];
  IndexCrosser ba;
  IndexCrosser ab;
  undefined1 local_60 [8];
  RangeIterator bi;
  RangeIterator ai;
  EdgePairVisitor *visitor_local;
  CrossingType type_local;
  S2ShapeIndex *b_index_local;
  S2ShapeIndex *a_index_local;
  
  RangeIterator::RangeIterator((RangeIterator *)&bi.range_max_,a_index);
  RangeIterator::RangeIterator((RangeIterator *)local_60,b_index);
  anon_unknown_0::IndexCrosser::IndexCrosser
            ((IndexCrosser *)((long)&ba.b_shape_edges_.rep_ + 0x378),a_index,b_index,type,visitor,
             false);
  anon_unknown_0::IndexCrosser::IndexCrosser
            ((IndexCrosser *)local_fa0,b_index,a_index,type,visitor,true);
  while( true ) {
    bVar1 = RangeIterator::done((RangeIterator *)&bi.range_max_);
    local_fde = 1;
    if (bVar1) {
      bVar1 = RangeIterator::done((RangeIterator *)local_60);
      local_fde = bVar1 ^ 0xff;
    }
    if ((local_fde & 1) == 0) break;
    local_fa8 = RangeIterator::range_max((RangeIterator *)&bi.range_max_);
    local_fb0 = (uint64)RangeIterator::range_min((RangeIterator *)local_60);
    bVar1 = ::operator<(local_fa8,(S2CellId)local_fb0);
    if (bVar1) {
      RangeIterator::SeekTo((RangeIterator *)&bi.range_max_,(RangeIterator *)local_60);
    }
    else {
      local_fb8 = RangeIterator::range_max((RangeIterator *)local_60);
      ab_relation = (int64)RangeIterator::range_min((RangeIterator *)&bi.range_max_);
      bVar1 = ::operator<(local_fb8,(S2CellId)ab_relation);
      if (bVar1) {
        RangeIterator::SeekTo((RangeIterator *)local_60,(RangeIterator *)&bi.range_max_);
      }
      else {
        local_fd0 = RangeIterator::id((RangeIterator *)&bi.range_max_);
        uVar3 = S2CellId::lsb(&local_fd0);
        local_fd8 = RangeIterator::id((RangeIterator *)local_60);
        uVar4 = S2CellId::lsb(&local_fd8);
        local_fc8 = uVar3 - uVar4;
        if (local_fc8 < 1) {
          if (local_fc8 < 0) {
            bVar1 = anon_unknown_0::IndexCrosser::VisitCrossings
                              ((IndexCrosser *)local_fa0,(RangeIterator *)local_60,
                               (RangeIterator *)&bi.range_max_);
            if (!bVar1) {
              a_index_local._7_1_ = false;
LAB_0050a336:
              anon_unknown_0::IndexCrosser::~IndexCrosser((IndexCrosser *)local_fa0);
              anon_unknown_0::IndexCrosser::~IndexCrosser
                        ((IndexCrosser *)((long)&ba.b_shape_edges_.rep_ + 0x378));
              RangeIterator::~RangeIterator((RangeIterator *)local_60);
              RangeIterator::~RangeIterator((RangeIterator *)&bi.range_max_);
              return a_index_local._7_1_;
            }
          }
          else {
            pSVar5 = RangeIterator::cell((RangeIterator *)&bi.range_max_);
            iVar2 = S2ShapeIndexCell::num_edges(pSVar5);
            if (0 < iVar2) {
              pSVar5 = RangeIterator::cell((RangeIterator *)local_60);
              iVar2 = S2ShapeIndexCell::num_edges(pSVar5);
              if (0 < iVar2) {
                pSVar5 = RangeIterator::cell((RangeIterator *)&bi.range_max_);
                b_cell = RangeIterator::cell((RangeIterator *)local_60);
                bVar1 = anon_unknown_0::IndexCrosser::VisitCellCellCrossings
                                  ((IndexCrosser *)((long)&ba.b_shape_edges_.rep_ + 0x378),pSVar5,
                                   b_cell);
                if (!bVar1) {
                  a_index_local._7_1_ = false;
                  goto LAB_0050a336;
                }
              }
            }
            RangeIterator::Next((RangeIterator *)&bi.range_max_);
            RangeIterator::Next((RangeIterator *)local_60);
          }
        }
        else {
          bVar1 = anon_unknown_0::IndexCrosser::VisitCrossings
                            ((IndexCrosser *)((long)&ba.b_shape_edges_.rep_ + 0x378),
                             (RangeIterator *)&bi.range_max_,(RangeIterator *)local_60);
          if (!bVar1) {
            a_index_local._7_1_ = false;
            goto LAB_0050a336;
          }
        }
      }
    }
  }
  a_index_local._7_1_ = true;
  goto LAB_0050a336;
}

Assistant:

bool VisitCrossingEdgePairs(const S2ShapeIndex& a_index,
                            const S2ShapeIndex& b_index,
                            CrossingType type, const EdgePairVisitor& visitor) {
  // We look for S2CellId ranges where the indexes of A and B overlap, and
  // then test those edges for crossings.

  // TODO(ericv): Use brute force if the total number of edges is small enough
  // (using a larger threshold if the S2ShapeIndex is not constructed yet).
  RangeIterator ai(a_index), bi(b_index);
  IndexCrosser ab(a_index, b_index, type, visitor, false);  // Tests A against B
  IndexCrosser ba(b_index, a_index, type, visitor, true);   // Tests B against A
  while (!ai.done() || !bi.done()) {
    if (ai.range_max() < bi.range_min()) {
      // The A and B cells don't overlap, and A precedes B.
      ai.SeekTo(bi);
    } else if (bi.range_max() < ai.range_min()) {
      // The A and B cells don't overlap, and B precedes A.
      bi.SeekTo(ai);
    } else {
      // One cell contains the other.  Determine which cell is larger.
      int64 ab_relation = ai.id().lsb() - bi.id().lsb();
      if (ab_relation > 0) {
        // A's index cell is larger.
        if (!ab.VisitCrossings(&ai, &bi)) return false;
      } else if (ab_relation < 0) {
        // B's index cell is larger.
        if (!ba.VisitCrossings(&bi, &ai)) return false;
      } else {
        // The A and B cells are the same.
        if (ai.cell().num_edges() > 0 && bi.cell().num_edges() > 0) {
          if (!ab.VisitCellCellCrossings(ai.cell(), bi.cell())) return false;
        }
        ai.Next();
        bi.Next();
      }
    }
  }
  return true;
}